

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O0

int in_tab(h264_cabac_se_val *tab,uint32_t val)

{
  int iVar1;
  int local_20;
  int i;
  uint32_t val_local;
  h264_cabac_se_val *tab_local;
  
  local_20 = 0;
  do {
    if (tab[local_20].blen == 0) {
      return 0;
    }
    if (tab[local_20].subtab == (h264_cabac_se_val *)0x0) {
      if (val == tab[local_20].val) {
        return 1;
      }
    }
    else {
      iVar1 = in_tab(tab[local_20].subtab,val);
      if (iVar1 != 0) {
        return 1;
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

static int in_tab(const struct h264_cabac_se_val *tab, uint32_t val) {
	int i;
	for (i = 0; tab[i].blen; i++) {
		if (tab[i].subtab) {
			if (in_tab(tab[i].subtab, val))
				return 1;
		} else {
			if (val == tab[i].val)
				return 1;
		}
	}
	return 0;
}